

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O0

void __thiscall QWidgetRepaintManager::addStaticWidget(QWidgetRepaintManager *this,QWidget *widget)

{
  long lVar1;
  bool bVar2;
  long in_RSI;
  QListSpecialMethodsBase<QWidget_*> *in_RDI;
  long in_FS_OFFSET;
  parameter_type in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RSI != 0) &&
     (bVar2 = QListSpecialMethodsBase<QWidget*>::contains<QWidget*>
                        (in_RDI,(QWidget **)in_stack_ffffffffffffffd8), !bVar2)) {
    QList<QWidget_*>::append((QList<QWidget_*> *)0x3a489e,in_stack_ffffffffffffffd8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetRepaintManager::addStaticWidget(QWidget *widget)
{
    if (!widget)
        return;

    Q_ASSERT(widget->testAttribute(Qt::WA_StaticContents));
    if (!staticWidgets.contains(widget))
        staticWidgets.append(widget);
}